

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void tricore_tr_tb_stop(DisasContextBase_conflict1 *dcbase,CPUState_conflict *cpu)

{
  DisasJumpType DVar1;
  TCGContext_conflict9 *pTVar2;
  TCGTemp *local_10;
  
  DVar1 = dcbase->is_jmp;
  if (DVar1 == DISAS_TARGET_6) {
    pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                        (long)(int)dcbase->pc_next);
    pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    local_10 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
    tcg_gen_callN_tricore(pTVar2,helper_uc_tricore_exit_tricore,(TCGTemp *)0x0,1,&local_10);
  }
  else if (DVar1 != DISAS_NORETURN) {
    if (DVar1 == DISAS_TOO_MANY) {
      gen_goto_tb((DisasContext_conflict14 *)dcbase,0,dcbase->pc_next);
      return;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/tricore/translate.c"
               ,0x2450,(char *)0x0);
  }
  return;
}

Assistant:

static void tricore_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);

    // if (ctx->base.singlestep_enabled && ctx->base.is_jmp != DISAS_NORETURN) {
    //     save_cpu_state(ctx, ctx->base.is_jmp != DISAS_EXIT);
    //     gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    // } else {
    switch (ctx->base.is_jmp) {
    case DISAS_TOO_MANY:
        gen_goto_tb(ctx, 0, ctx->base.pc_next);
        break;
    case DISAS_UC_EXIT:
        gen_save_pc(ctx, ctx->base.pc_next);
        gen_helper_uc_tricore_exit(ctx->uc->tcg_ctx, ctx->uc->tcg_ctx->cpu_env);
        break;
    case DISAS_NORETURN:
        break;
    default:
        g_assert_not_reached();
    }
}